

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-netcdf-cursor.c
# Opt level: O2

int read_basic_type(coda_cursor_conflict *cursor,void *dst,long size_boundary)

{
  int iVar1;
  coda_type_class cVar2;
  int iVar3;
  long lVar4;
  coda_backend cVar5;
  size_t __n;
  uchar *v;
  char *message;
  coda_dynamic_type_struct *pcVar6;
  coda_dynamic_type_struct *pcVar7;
  
  lVar4 = (long)cursor->n;
  pcVar7 = cursor->stack[lVar4 + -1].type;
  cVar5 = pcVar7[1].backend;
  iVar3 = 0;
  if (cVar5 == coda_backend_ascii) {
    pcVar7 = cursor->stack[lVar4 + -2].type;
    iVar3 = (int)cursor->stack[lVar4 + -1].index;
    cVar5 = pcVar7[1].backend;
  }
  if (cVar5 != 2) {
    __assert_fail("variable->tag == tag_cdf_variable",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-cursor.c"
                  ,0x193,"int read_basic_type(const coda_cursor *, void *, long)");
  }
  pcVar6 = *(coda_dynamic_type_struct **)(pcVar7 + 2);
  if (*(coda_dynamic_type_struct **)(pcVar7 + 2) == (coda_dynamic_type_struct *)0x0) {
    pcVar6 = pcVar7;
  }
  iVar1 = *(int *)((long)&pcVar7[2].definition + 4);
  lVar4 = *(long *)(*(long *)(pcVar7 + 4) + (long)(iVar3 / iVar1) * 8);
  if (lVar4 < 0) {
    message = "Missing record not supported for CDF variable";
LAB_0014d6d0:
    coda_set_error(-200,message);
LAB_0014d6f4:
    iVar3 = -1;
  }
  else {
    cVar2 = pcVar6->definition->type_class;
    cVar5 = pcVar7[3].backend;
    lVar4 = lVar4 + (int)((iVar3 % iVar1) * cVar5);
    __n = size_boundary & 0xffffffff;
    if ((int)cVar5 <= size_boundary) {
      __n = (size_t)cVar5;
    }
    if (size_boundary < 0) {
      __n = (size_t)cVar5;
    }
    if ((pcVar7[4].definition == (coda_type *)0x0) || ((int)__n < 1)) {
      iVar3 = read_bytes((coda_product *)cursor->product[1].filename,lVar4,(long)(int)__n,dst);
      if (iVar3 != 0) goto LAB_0014d6f4;
    }
    else {
      if ((int)(cVar5 * iVar1 * *(int *)&pcVar7[2].definition) < lVar4) {
        message = "Offset too large in accessing data of CDF variable";
        goto LAB_0014d6d0;
      }
      memcpy(dst,(void *)((long)&(pcVar7[4].definition)->format + lVar4),__n);
    }
    iVar3 = 0;
    if ((cVar2 != coda_text_class) && (*(int *)&cursor->product[1].field_0x14 == 0)) {
      switch(pcVar7[3].backend) {
      case coda_backend_binary:
        break;
      case 2:
        *(ushort *)dst = *dst << 8 | *dst >> 8;
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-cursor.c"
                      ,0x1d3,"int read_basic_type(const coda_cursor *, void *, long)");
      case 4:
        swap4(dst);
        break;
      case 8:
        swap8(dst);
      }
    }
  }
  return iVar3;
}

Assistant:

static int read_basic_type(const coda_cursor *cursor, void *dst, long size_boundary)
{
    coda_netcdf_basic_type *type;
    coda_netcdf_product *product;
    int64_t offset;
    int64_t byte_size;

    type = (coda_netcdf_basic_type *)cursor->stack[cursor->n - 1].type;
    product = (coda_netcdf_product *)cursor->product;
    offset = type->offset;
    byte_size = type->definition->bit_size >> 3;

    if (cursor->stack[cursor->n - 2].type->backend == coda_backend_netcdf &&
        cursor->stack[cursor->n - 2].type->definition->type_class == coda_array_class)
    {
        if (type->record_var)
        {
            coda_netcdf_array *array = (coda_netcdf_array *)cursor->stack[cursor->n - 2].type;
            long num_sub_elements;
            long record_index;

            num_sub_elements = array->definition->num_elements / array->definition->dim[0];
            record_index = cursor->stack[cursor->n - 1].index / num_sub_elements;
            /* jump to record */
            offset += record_index * product->record_size;
            /* jump to sub element in record */
            offset += (cursor->stack[cursor->n - 1].index - record_index * num_sub_elements) * byte_size;
        }
        else
        {
            offset += cursor->stack[cursor->n - 1].index * byte_size;
        }
    }

    if (size_boundary >= 0 && byte_size > size_boundary)
    {
        if (read_bytes(product->raw_product, offset, size_boundary, dst) != 0)
        {
            return -1;
        }
    }
    else
    {
        if (read_bytes(product->raw_product, offset, byte_size, dst) != 0)
        {
            return -1;
        }
    }

#ifndef WORDS_BIGENDIAN
    if (type->definition->type_class == coda_integer_class || type->definition->type_class == coda_real_class)
    {
        switch (type->definition->bit_size)
        {
            case 8:
                /* no endianness conversion needed */
                break;
            case 16:
                swap2(dst);
                break;
            case 32:
                swap4(dst);
                break;
            case 64:
                swap8(dst);
                break;
            default:
                assert(0);
                exit(1);
        }
    }
#endif

    return 0;
}